

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *param_2)

{
  long in_RSI;
  ResultValueBase<Catch::clara::detail::ParseResultType> *in_RDI;
  ResultValueBase<Catch::clara::detail::ParseResultType> *in_stack_ffffffffffffffe0;
  
  ResultValueBase<Catch::clara::detail::ParseResultType>::ResultValueBase
            (in_stack_ffffffffffffffe0,in_RDI);
  (in_RDI->super_ResultBase)._vptr_ResultBase = (_func_int **)&PTR__BasicResult_002436f8;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 0x10));
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }